

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_compiler.hpp
# Opt level: O3

void __thiscall
boost::xpressive::
regex_compiler<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
::regex_compiler(regex_compiler<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
                 *this,regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *traits)

{
  compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  char_type cVar2;
  char_class_type cVar3;
  undefined8 in_RAX;
  size_t j;
  long lVar4;
  char_type name [6];
  undefined8 local_28;
  
  local_28._6_2_ = (ushort)((ulong)in_RAX >> 0x30);
  this_00 = &this->traits_;
  this->mark_count_ = 0;
  this->hidden_mark_count_ = 0;
  compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
  ::compiler_traits(this_00,traits);
  lVar4 = 0;
  this->upper_ = 0;
  p_Var1 = &(this->rules_)._M_t._M_impl.super__Rb_tree_header;
  (this->self_).px = (element_type *)0x0;
  (this->self_).pn.pi_ = (sp_counted_base *)0x0;
  *(undefined8 *)&(this->rules_)._M_t._M_impl = 0;
  *(undefined8 *)&(this->rules_)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->rules_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_28 = (ulong)local_28._6_2_ << 0x30;
  do {
    cVar2 = cpp_regex_traits<char>::widen((cpp_regex_traits<char> *)this_00,"upper"[lVar4]);
    *(char_type *)((long)&local_28 + lVar4) = cVar2;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  cVar3 = cpp_regex_traits<char>::lookup_classname<char*>
                    ((cpp_regex_traits<char> *)this_00,(char *)&local_28,
                     (char *)((long)&local_28 + 5),false);
  this->upper_ = cVar3;
  return;
}

Assistant:

explicit regex_compiler(RegexTraits const &traits = RegexTraits())
      : mark_count_(0)
      , hidden_mark_count_(0)
      , traits_(traits)
      , upper_(0)
      , self_()
      , rules_()
    {
        this->upper_ = lookup_classname(this->rxtraits(), "upper");
    }